

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O2

char * ctemplate::ExpandIs(Template *tpl,TemplateDictionary *dict,PerExpandData *per_expand_data,
                          bool expected)

{
  bool bVar1;
  char *__dest;
  string outstring;
  
  outstring._M_dataplus._M_p = (pointer)&outstring.field_2;
  outstring._M_string_length = 0;
  outstring.field_2._M_local_buf[0] = '\0';
  if (per_expand_data == (PerExpandData *)0x0) {
    bVar1 = Template::Expand(tpl,&outstring,(TemplateDictionaryInterface *)dict);
    if (bVar1 == expected) goto LAB_00106f73;
    printf("ASSERT FAILED, line %d: %s\n",0xac,"expected == tpl->Expand(&outstring, dict)");
    bVar1 = Template::Expand(tpl,&outstring,(TemplateDictionaryInterface *)dict);
    if (bVar1 != expected) {
      __assert_fail("expected == tpl->Expand(&outstring, dict)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                    ,0xac,
                    "const char *ctemplate::ExpandIs(const Template *, const TemplateDictionary *, PerExpandData *, bool)"
                   );
    }
  }
  else {
    bVar1 = Template::ExpandWithData
                      (tpl,&outstring,(TemplateDictionaryInterface *)dict,per_expand_data);
    if (bVar1 == expected) {
LAB_00106f73:
      __dest = (char *)operator_new__(outstring._M_string_length + 1);
      strcpy(__dest,outstring._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&outstring);
      return __dest;
    }
    printf("ASSERT FAILED, line %d: %s\n",0xaa,
           "expected == tpl->ExpandWithData(&outstring, dict, per_expand_data)");
    bVar1 = Template::ExpandWithData
                      (tpl,&outstring,(TemplateDictionaryInterface *)dict,per_expand_data);
    if (bVar1 != expected) {
      __assert_fail("expected == tpl->ExpandWithData(&outstring, dict, per_expand_data)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                    ,0xaa,
                    "const char *ctemplate::ExpandIs(const Template *, const TemplateDictionary *, PerExpandData *, bool)"
                   );
    }
  }
  exit(1);
}

Assistant:

const char* ExpandIs(const Template* tpl, const TemplateDictionary *dict,
                     PerExpandData* per_expand_data, bool expected) {
  string outstring;
  if (per_expand_data)
    ASSERT(expected == tpl->ExpandWithData(&outstring, dict, per_expand_data));
  else
    ASSERT(expected == tpl->Expand(&outstring, dict));


  char* buf = new char[outstring.size()+1];
  strcpy(buf, outstring.c_str());
  return buf;
}